

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall testing::Matcher<unsigned_char>::Matcher(Matcher<unsigned_char> *this,uchar value)

{
  ComparisonBase local_29;
  MatcherBase<unsigned_char> local_28;
  
  (this->super_MatcherBase<unsigned_char>).impl_.value_ =
       (MatcherInterface<const_unsigned_char_&> *)0x0;
  (this->super_MatcherBase<unsigned_char>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_char>).impl_.link_;
  (this->super_MatcherBase<unsigned_char>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00196080;
  local_29 = (ComparisonBase)value;
  internal::ComparisonBase::operator_cast_to_Matcher((Matcher<unsigned_char> *)&local_28,&local_29);
  internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_>::operator=
            (&(this->super_MatcherBase<unsigned_char>).impl_,&local_28.impl_);
  internal::MatcherBase<unsigned_char>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }